

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall
Jinx::Allocator<std::_Rb_tree_node<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>::deallocate
          (Allocator<std::_Rb_tree_node<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_> *this,
          void *ptr,size_t n)

{
  __int_type local_10;
  void *local_8;
  
  if (ptr != (void *)0x0) {
    LOCK();
    Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
    UNLOCK();
    if ((ulong)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i <
        (ulong)Mem::freeCount.super___atomic_base<unsigned_long>._M_i) {
      __assert_fail("Mem::allocationCount >= Mem::freeCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                    ,0x151b,"void Jinx::MemFree(void *, size_t)");
    }
    local_10 = n * 0x70;
    if ((ulong)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i < local_10) {
      __assert_fail("Mem::allocatedMemory >= bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                    ,0x151c,"void Jinx::MemFree(void *, size_t)");
    }
    LOCK();
    Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + n * -0x70);
    UNLOCK();
    local_8 = ptr;
    if (Mem::freeFn.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*Mem::freeFn._M_invoker)((_Any_data *)&Mem::freeFn,&local_8,&local_10);
  }
  return;
}

Assistant:

void deallocate(void* ptr, size_t n) { Jinx::MemFree(static_cast<T*> (ptr), n * sizeof(value_type)); }